

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_mask_tri(REF_GRID ref_grid,REF_BOOL *replace,REF_INT ldim)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_GLOB *pRVar3;
  REF_ADJ pRVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  
  pRVar1 = ref_grid->node;
  if (0 < pRVar1->max) {
    pRVar2 = ref_grid->cell[3];
    pRVar3 = pRVar1->global;
    lVar7 = 0;
    do {
      if (-1 < pRVar3[lVar7] && 0 < ldim) {
        pRVar4 = pRVar2->ref_adj;
        uVar5 = 0;
        do {
          uVar6 = 0;
          if (lVar7 < pRVar4->nnode) {
            uVar6 = (uint)(pRVar4->first[lVar7] != -1);
          }
          replace[uVar5] = uVar6;
          uVar5 = uVar5 + 1;
        } while ((uint)ldim != uVar5);
      }
      lVar7 = lVar7 + 1;
      replace = replace + (uint)ldim;
    } while (lVar7 < pRVar1->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_recon_mask_tri(REF_GRID ref_grid, REF_BOOL *replace,
                                      REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT i, node;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < ldim; i++) {
      replace[i + ldim * node] = !ref_cell_node_empty(ref_cell, node);
    }
  }
  return REF_SUCCESS;
}